

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::rejectOrder
          (Application *this,SenderCompID *sender,TargetCompID *target,ClOrdID *clOrdID,
          Symbol *symbol,Side *side,string *message)

{
  FieldBase local_530;
  PRICE local_4d8;
  QTY local_4d0;
  QTY local_4c8;
  string local_4c0;
  FieldBase local_4a0;
  FieldBase local_448;
  FieldBase local_3f0;
  FieldBase local_398;
  SenderCompID senderCompID;
  TargetCompID targetCompID;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport fixOrder;
  
  FIX::TargetCompID::TargetCompID
            (&targetCompID,&(sender->super_StringField).super_FieldBase.m_string);
  FIX::SenderCompID::SenderCompID
            (&senderCompID,&(target->super_StringField).super_FieldBase.m_string);
  FIX::OrderID::OrderID
            ((OrderID *)&local_530,&(clOrdID->super_StringField).super_FieldBase.m_string);
  IDGenerator::genExecutionID_abi_cxx11_(&local_4c0,&this->m_generator);
  FIX::ExecID::ExecID((ExecID *)&local_4a0,&local_4c0);
  FIX::ExecTransType::ExecTransType((ExecTransType *)&local_398,"0812211Application");
  FIX::ExecType::ExecType((ExecType *)&local_3f0,"812211Application");
  FIX::OrdStatus::OrdStatus((OrdStatus *)&local_448,"812211Application");
  local_4c8 = 0.0;
  FIX::LeavesQty::LeavesQty((LeavesQty *)&local_1e0,&local_4c8);
  local_4d0 = 0.0;
  FIX::CumQty::CumQty((CumQty *)&local_238,&local_4d0);
  local_4d8 = 0.0;
  FIX::AvgPx::AvgPx((AvgPx *)&local_290,&local_4d8);
  FIX42::ExecutionReport::ExecutionReport
            (&fixOrder,(OrderID *)&local_530,(ExecID *)&local_4a0,(ExecTransType *)&local_398,
             (ExecType *)&local_3f0,(OrdStatus *)&local_448,symbol,side,(LeavesQty *)&local_1e0,
             (CumQty *)&local_238,(AvgPx *)&local_290);
  FIX::FieldBase::~FieldBase(&local_290);
  FIX::FieldBase::~FieldBase(&local_238);
  FIX::FieldBase::~FieldBase(&local_1e0);
  FIX::FieldBase::~FieldBase(&local_448);
  FIX::FieldBase::~FieldBase(&local_3f0);
  FIX::FieldBase::~FieldBase(&local_398);
  FIX::FieldBase::~FieldBase(&local_4a0);
  std::__cxx11::string::~string((string *)&local_4c0);
  FIX::FieldBase::~FieldBase(&local_530);
  FIX42::ExecutionReport::set(&fixOrder,clOrdID);
  FIX::Text::Text((Text *)&local_530,message);
  FIX42::ExecutionReport::set(&fixOrder,(Text *)&local_530);
  FIX::FieldBase::~FieldBase(&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"",(allocator<char> *)&local_4a0);
  FIX::Session::sendToTarget((Message *)&fixOrder,&senderCompID,&targetCompID,(string *)&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  FIX::Message::~Message((Message *)&fixOrder);
  FIX::FieldBase::~FieldBase((FieldBase *)&senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&targetCompID);
  return;
}

Assistant:

void Application::rejectOrder(
    const FIX::SenderCompID &sender,
    const FIX::TargetCompID &target,
    const FIX::ClOrdID &clOrdID,
    const FIX::Symbol &symbol,
    const FIX::Side &side,
    const std::string &message) {
  FIX::TargetCompID targetCompID(sender.getValue());
  FIX::SenderCompID senderCompID(target.getValue());

  FIX42::ExecutionReport fixOrder(
      FIX::OrderID(clOrdID.getValue()),
      FIX::ExecID(m_generator.genExecutionID()),
      FIX::ExecTransType(FIX::ExecTransType_NEW),
      FIX::ExecType(FIX::ExecType_REJECTED),
      FIX::OrdStatus(FIX::ExecType_REJECTED),
      symbol,
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(0),
      FIX::AvgPx(0));

  fixOrder.set(clOrdID);
  fixOrder.set(FIX::Text(message));

  try {
    FIX::Session::sendToTarget(fixOrder, senderCompID, targetCompID);
  } catch (FIX::SessionNotFound &) {}
}